

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputedValues.cpp
# Opt level: O0

String * __thiscall
Rml::Style::ComputedValues::font_family_abi_cxx11_
          (String *__return_storage_ptr__,ComputedValues *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  Property *local_20;
  Property *p;
  ComputedValues *this_local;
  
  p = (Property *)this;
  this_local = (ComputedValues *)__return_storage_ptr__;
  local_20 = Element::GetProperty(this->element,FontFamily);
  if (local_20 == (Property *)0x0) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    Property::Get<std::__cxx11::string>(&local_40,local_20);
    ComputeFontFamily(__return_storage_ptr__,&local_40);
    ::std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

String Style::ComputedValues::font_family() const
{
	if (auto p = element->GetProperty(PropertyId::FontFamily))
		return ComputeFontFamily(p->Get<String>());

	return String();
}